

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

bool __thiscall QDateTimeEditPrivate::isSeparatorKey(QDateTimeEditPrivate *this,QKeyEvent *ke)

{
  ushort uVar1;
  int iVar2;
  QArrayData *pQVar3;
  ushort *puVar4;
  char cVar5;
  ulong uVar6;
  long lVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QArrayData *local_40;
  undefined8 local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = *(QArrayData **)(ke + 0x28);
  lVar7 = *(long *)(ke + 0x38);
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((lVar7 == 0) ||
     (iVar2 = *(int *)&this->field_0x3e0, *(long *)&this->field_0x418 <= (long)iVar2 + 1)) {
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  else {
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    if (-1 < iVar2) {
      uVar6 = QDateTimeParser::fieldInfo((int)this + 0x3d8);
      pQVar3 = *(QArrayData **)(ke + 0x28);
      puVar4 = *(ushort **)(ke + 0x30);
      if ((uVar6 & 1) == 0) {
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        uVar1 = *puVar4;
        cVar5 = '\x01';
        if ((9 < uVar1 - 0x30) && (0x39 < uVar1 - 0x41 || 0xfffffff9 < uVar1 - 0x61)) {
          if (uVar1 < 0x80) {
LAB_003e602b:
            cVar5 = '\0';
          }
          else {
            cVar5 = QChar::isLetterOrNumber_helper((uint)uVar1);
          }
        }
      }
      else {
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        uVar1 = *puVar4;
        cVar5 = '\x01';
        if (9 < uVar1 - 0x30) {
          if (uVar1 < 0x80) goto LAB_003e602b;
          cVar5 = QChar::isNumber_helper((uint)uVar1);
        }
      }
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
      if (cVar5 == '\0') {
        iVar2 = *(int *)&this->field_0x3e0;
        lVar7 = *(long *)&this->field_0x428;
        local_40 = *(QArrayData **)(ke + 0x28);
        local_38 = *(undefined8 *)(ke + 0x30);
        local_30 = *(undefined8 *)(ke + 0x38);
        if (local_40 != (QArrayData *)0x0) {
          LOCK();
          (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_40->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        lVar7 = QString::indexOf((QString *)(lVar7 + (long)iVar2 * 0x18 + 0x18),(longlong)&local_40,
                                 CaseInsensitive);
        bVar8 = lVar7 != -1;
        if (local_40 != (QArrayData *)0x0) {
          LOCK();
          (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_40,2,0x10);
          }
        }
        goto LAB_003e6051;
      }
    }
  }
  bVar8 = false;
LAB_003e6051:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool QDateTimeEditPrivate::isSeparatorKey(const QKeyEvent *ke) const
{
    if (!ke->text().isEmpty() && currentSectionIndex + 1 < sectionNodes.size() && currentSectionIndex >= 0) {
        if (fieldInfo(currentSectionIndex) & Numeric) {
            if (ke->text().at(0).isNumber())
                return false;
        } else if (ke->text().at(0).isLetterOrNumber()) {
            return false;
        }
        return separators.at(currentSectionIndex + 1).contains(ke->text());
    }
    return false;
}